

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O2

int ly_time_tz_offset_at(time_t time)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  tm tm_utc;
  tm tm_local;
  tm local_90;
  tm local_58;
  time_t local_20;
  
  tzset();
  localtime_r(&local_20,&local_58);
  gmtime_r(&local_20,&local_90);
  piVar1 = &local_90.tm_hour;
  piVar3 = piVar1;
  if ((((local_58.tm_year < local_90.tm_year) ||
       (piVar2 = &local_58.tm_hour, piVar3 = piVar2, local_90.tm_year < local_58.tm_year)) ||
      (piVar3 = piVar1, local_58.tm_mon < local_90.tm_mon)) ||
     (((piVar3 = piVar2, local_90.tm_mon < local_58.tm_mon ||
       (piVar3 = piVar1, local_58.tm_mday < local_90.tm_mday)) ||
      (piVar3 = piVar2, local_90.tm_mday < local_58.tm_mday)))) {
    *piVar3 = *piVar3 + 0x18;
  }
  return ((local_58.tm_hour - local_90.tm_hour) * 0xe10 + local_58.tm_sec +
         (local_58.tm_min - local_90.tm_min) * 0x3c) - local_90.tm_sec;
}

Assistant:

LIBYANG_API_DEF int
ly_time_tz_offset_at(time_t time)
{
    struct tm tm_local, tm_utc;
    int result = 0;

    /* init timezone */
    tzset();

    /* get local and UTC time */
    localtime_r(&time, &tm_local);
    gmtime_r(&time, &tm_utc);

    /* account for year/month/day change by adding/subtracting from the hours, the change cannot be more than 1 day */
    if (tm_local.tm_year < tm_utc.tm_year) {
        tm_utc.tm_hour += 24;
    } else if (tm_local.tm_year > tm_utc.tm_year) {
        tm_local.tm_hour += 24;
    } else if (tm_local.tm_mon < tm_utc.tm_mon) {
        tm_utc.tm_hour += 24;
    } else if (tm_local.tm_mon > tm_utc.tm_mon) {
        tm_local.tm_hour += 24;
    } else if (tm_local.tm_mday < tm_utc.tm_mday) {
        tm_utc.tm_hour += 24;
    } else if (tm_local.tm_mday > tm_utc.tm_mday) {
        tm_local.tm_hour += 24;
    }

    /* hours shift in seconds */
    result += (tm_local.tm_hour - tm_utc.tm_hour) * 3600;

    /* minutes shift in seconds */
    result += (tm_local.tm_min - tm_utc.tm_min) * 60;

    /* seconds shift */
    result += tm_local.tm_sec - tm_utc.tm_sec;

    return result;
}